

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::createShaderProgs(SourceCollections *dst)

{
  ProgramSources *this;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [40];
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"test",&local_79);
  this = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void) { gl_Position = a_position; }\n"
             ,&local_7a);
  glu::VertexSource::VertexSource((VertexSource *)local_58,&local_78);
  glu::ProgramSources::operator<<(this,(ShaderSource *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void createShaderProgs (SourceCollections& dst)
{
	dst.glslSources.add("test") << glu::VertexSource(
		"#version 310 es\n"
		"in highp vec4 a_position;\n"
		"void main (void) { gl_Position = a_position; }\n");
}